

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O3

int ffmpeg_init_library(void)

{
  av_log_set_level(0x10);
  return 0;
}

Assistant:

static int
ffmpeg_init_library(void)
{
#if LIBAVCODEC_VERSION_INT < AV_VERSION_INT(58, 9, 100)
	// Register all formats and codecs
	av_register_all();
#endif
	av_log_set_level(AV_LOG_ERROR);
	return 0;
}